

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

int Of_SetCutIsContainedOrder(Of_Cut_t *pBase,Of_Cut_t *pCut)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar4 = *(uint *)&pBase->field_0x10 >> 0x1b;
  uVar3 = *(uint *)&pCut->field_0x10 >> 0x1b;
  if (uVar4 == uVar3) {
    uVar5 = 0;
    do {
      if (uVar4 == uVar5) {
        return 1;
      }
      piVar1 = pBase->pLeaves + uVar5;
      piVar2 = pCut->pLeaves + uVar5;
      uVar5 = uVar5 + 1;
    } while (*piVar1 == *piVar2);
  }
  else {
    if (uVar4 <= uVar3) {
      __assert_fail("nSizeB > nSizeC",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                    ,0x253,"int Of_SetCutIsContainedOrder(Of_Cut_t *, Of_Cut_t *)");
    }
    if (*(uint *)&pCut->field_0x10 < 0x8000000) {
      return 1;
    }
    uVar6 = 0;
    for (uVar5 = 0; (uVar4 != uVar5 && (pBase->pLeaves[uVar5] <= pCut->pLeaves[(int)uVar6]));
        uVar5 = uVar5 + 1) {
      if ((pBase->pLeaves[uVar5] == pCut->pLeaves[(int)uVar6]) &&
         (uVar6 = uVar6 + 1, uVar6 == uVar3)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static inline int Of_SetCutIsContainedOrder( Of_Cut_t * pBase, Of_Cut_t * pCut ) // check if pCut is contained in pBase
{
    int i, nSizeB = pBase->nLeaves;
    int k, nSizeC = pCut->nLeaves;
    if ( nSizeB == nSizeC )
    {
        for ( i = 0; i < nSizeB; i++ )
            if ( pBase->pLeaves[i] != pCut->pLeaves[i] )
                return 0;
        return 1;
    }
    assert( nSizeB > nSizeC ); 
    if ( nSizeC == 0 )
        return 1;
    for ( i = k = 0; i < nSizeB; i++ )
    {
        if ( pBase->pLeaves[i] > pCut->pLeaves[k] )
            return 0;
        if ( pBase->pLeaves[i] == pCut->pLeaves[k] )
        {
            if ( ++k == nSizeC )
                return 1;
        }
    }
    return 0;
}